

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O2

int libssh2_agent_userauth(LIBSSH2_AGENT *agent,char *username,libssh2_agent_publickey *identity)

{
  LIBSSH2_SESSION *pLVar1;
  int iVar2;
  time_t start_time;
  size_t username_len;
  void *abstract;
  
  if (agent->session->userauth_pblc_state == libssh2_NB_state_idle) {
    *(undefined8 *)&(agent->transctx).state = 0;
    (agent->transctx).send_recv_total = 0;
    (agent->transctx).response = (uchar *)0x0;
    (agent->transctx).response_len = 0;
    (agent->transctx).request = (uchar *)0x0;
    (agent->transctx).request_len = 0;
    agent->identity = (agent_publickey *)identity->node;
  }
  abstract = agent;
  start_time = time((time_t *)0x0);
  while( true ) {
    pLVar1 = agent->session;
    username_len = strlen(username);
    iVar2 = _libssh2_userauth_publickey
                      (pLVar1,username,username_len,identity->blob,identity->blob_len,agent_sign,
                       &abstract);
    if (iVar2 != -0x25) {
      return iVar2;
    }
    pLVar1 = agent->session;
    if ((pLVar1 == (LIBSSH2_SESSION *)0x0) || (pLVar1->api_block_mode == 0)) break;
    iVar2 = _libssh2_wait_socket(pLVar1,start_time);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  return -0x25;
}

Assistant:

LIBSSH2_API int
libssh2_agent_userauth(LIBSSH2_AGENT *agent,
                       const char *username,
                       struct libssh2_agent_publickey *identity)
{
    void *abstract = agent;
    int rc;

    if(agent->session->userauth_pblc_state == libssh2_NB_state_idle) {
        memset(&agent->transctx, 0, sizeof(agent->transctx));
        agent->identity = identity->node;
    }

    BLOCK_ADJUST(rc, agent->session,
                 _libssh2_userauth_publickey(agent->session, username,
                                             strlen(username),
                                             identity->blob,
                                             identity->blob_len,
                                             agent_sign,
                                             &abstract));
    return rc;
}